

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob-test.c++
# Opt level: O2

void __thiscall capnp::anon_unknown_0::TestCase60::run(TestCase60 *this)

{
  bool bVar1;
  ArrayPtr<const_unsigned_char> AVar2;
  Builder builder;
  ArrayPtr<const_unsigned_char> local_80;
  Reader data3;
  Reader data2;
  byte c [4];
  ArrayPtr<unsigned_char> local_48;
  Reader data;
  
  AVar2 = (ArrayPtr<const_unsigned_char>)dataLit("foo");
  data2.super_ArrayPtr<const_unsigned_char> = AVar2;
  data.super_ArrayPtr<const_unsigned_char> = AVar2;
  bVar1 = kj::ArrayPtr<const_unsigned_char>::operator==
                    (&data2.super_ArrayPtr<const_unsigned_char>,
                     &data.super_ArrayPtr<const_unsigned_char>);
  if (kj::_::Debug::minSeverity < 3 && !bVar1) {
    data2.super_ArrayPtr<const_unsigned_char> = AVar2;
    kj::_::Debug::log<char_const(&)[44],capnp::Data::Reader,capnp::Data::Reader&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
               ,0x3f,ERROR,
               "\"failed: expected \" \"(dataLit(\\\"foo\\\")) == (data)\", dataLit(\"foo\"), data",
               (char (*) [44])"failed: expected (dataLit(\"foo\")) == (data)",&data2,
               (Reader *)&data.super_ArrayPtr<const_unsigned_char>);
  }
  if ((data.super_ArrayPtr<const_unsigned_char>.size_ != 3) && (kj::_::Debug::minSeverity < 3)) {
    data3.super_ArrayPtr<const_unsigned_char>.ptr._0_4_ = 3;
    data2.super_ArrayPtr<const_unsigned_char>.ptr =
         (uchar *)data.super_ArrayPtr<const_unsigned_char>.size_;
    kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
               ,0x40,ERROR,"\"failed: expected \" \"(3u) == (data.size())\", 3u, data.size()",
               (char (*) [39])"failed: expected (3u) == (data.size())",(uint *)&data3,
               (unsigned_long *)&data2.super_ArrayPtr<const_unsigned_char>);
  }
  AVar2 = (ArrayPtr<const_unsigned_char>)dataLit("bar");
  data3.super_ArrayPtr<const_unsigned_char> = AVar2;
  data2.super_ArrayPtr<const_unsigned_char> = AVar2;
  bVar1 = kj::ArrayPtr<const_unsigned_char>::operator==
                    (&data3.super_ArrayPtr<const_unsigned_char>,
                     &data2.super_ArrayPtr<const_unsigned_char>);
  if ((!bVar1) && (kj::_::Debug::minSeverity < 3)) {
    data3.super_ArrayPtr<const_unsigned_char> = AVar2;
    kj::_::Debug::log<char_const(&)[45],capnp::Data::Reader,capnp::Data::Reader&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
               ,0x43,ERROR,
               "\"failed: expected \" \"(dataLit(\\\"bar\\\")) == (data2)\", dataLit(\"bar\"), data2"
               ,(char (*) [45])"failed: expected (dataLit(\"bar\")) == (data2)",&data3,
               (Reader *)&data2.super_ArrayPtr<const_unsigned_char>);
  }
  builtin_memcpy(c,"baz",4);
  data3.super_ArrayPtr<const_unsigned_char>.size_ = 3;
  data3.super_ArrayPtr<const_unsigned_char>.ptr = c;
  AVar2 = (ArrayPtr<const_unsigned_char>)dataLit("baz");
  builder.super_ArrayPtr<unsigned_char> = (ArrayPtr<unsigned_char>)AVar2;
  bVar1 = kj::ArrayPtr<const_unsigned_char>::operator==
                    ((ArrayPtr<const_unsigned_char> *)&builder,
                     &data3.super_ArrayPtr<const_unsigned_char>);
  if ((!bVar1) && (kj::_::Debug::minSeverity < 3)) {
    builder.super_ArrayPtr<unsigned_char> = (ArrayPtr<unsigned_char>)AVar2;
    kj::_::Debug::log<char_const(&)[45],capnp::Data::Reader,capnp::Data::Reader&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
               ,0x47,ERROR,
               "\"failed: expected \" \"(dataLit(\\\"baz\\\")) == (data3)\", dataLit(\"baz\"), data3"
               ,(char (*) [45])"failed: expected (dataLit(\"baz\")) == (data3)",(Reader *)&builder,
               (Reader *)&data3.super_ArrayPtr<const_unsigned_char>);
  }
  builder.super_ArrayPtr<unsigned_char>.size_ = 3;
  builder.super_ArrayPtr<unsigned_char>.ptr = c;
  local_80 = AVar2;
  bVar1 = kj::ArrayPtr<unsigned_char_const>::operator==
                    ((ArrayPtr<unsigned_char_const> *)&local_80,
                     &builder.super_ArrayPtr<unsigned_char>);
  if ((!bVar1) && (kj::_::Debug::minSeverity < 3)) {
    local_80 = AVar2;
    kj::_::Debug::log<char_const(&)[47],capnp::Data::Reader,capnp::Data::Builder&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
               ,0x4a,ERROR,
               "\"failed: expected \" \"(dataLit(\\\"baz\\\")) == (builder)\", dataLit(\"baz\"), builder"
               ,(char (*) [47])"failed: expected (dataLit(\"baz\")) == (builder)",
               (Reader *)&local_80,(Builder *)&builder.super_ArrayPtr<unsigned_char>);
  }
  AVar2 = (ArrayPtr<const_unsigned_char>)dataLit("az");
  local_48.ptr = builder.super_ArrayPtr<unsigned_char>.ptr + 1;
  local_48.size_ = 2;
  local_80 = AVar2;
  bVar1 = kj::ArrayPtr<unsigned_char_const>::operator==
                    ((ArrayPtr<unsigned_char_const> *)&local_80,&local_48);
  if ((!bVar1) && (kj::_::Debug::minSeverity < 3)) {
    local_48.ptr = builder.super_ArrayPtr<unsigned_char>.ptr + 1;
    local_48.size_ = 2;
    local_80 = AVar2;
    kj::_::Debug::log<char_const(&)[58],capnp::Data::Reader,kj::ArrayPtr<unsigned_char>>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/blob-test.c++"
               ,0x4c,ERROR,
               "\"failed: expected \" \"(dataLit(\\\"az\\\")) == (builder.slice(1, 3))\", dataLit(\"az\"), builder.slice(1, 3)"
               ,(char (*) [58])"failed: expected (dataLit(\"az\")) == (builder.slice(1, 3))",
               (Reader *)&local_80,&local_48);
  }
  return;
}

Assistant:

TEST(Blob, Data) {
  Data::Reader data = dataLit("foo");

  EXPECT_EQ(dataLit("foo"), data);
  EXPECT_EQ(3u, data.size());

  Data::Reader data2 = dataLit("bar");
  EXPECT_EQ(dataLit("bar"), data2);

  byte c[4] = "baz";
  Data::Reader data3(c, 3);
  EXPECT_EQ(dataLit("baz"), data3);

  Data::Builder builder(c, 3);
  EXPECT_EQ(dataLit("baz"), builder);

  EXPECT_EQ(dataLit("az"), builder.slice(1, 3));
}